

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.h
# Opt level: O0

void __thiscall Jupiter::GenericCommand::ResponseLine::~ResponseLine(ResponseLine *this)

{
  ResponseLine *this_local;
  
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

struct JUPITER_API ResponseLine
		{
			std::string response;
			GenericCommand::DisplayType type;
			ResponseLine *next = nullptr;

			/**
			* @brief Sets the response and type of the ResponseLine.
			*
			* @param in_response Value to set response to.
			* @param in_type Value to set type to.
			* @return This.
			*/
			ResponseLine *set(std::string_view response, GenericCommand::DisplayType type);
			ResponseLine() = default;
			ResponseLine(std::string_view response, GenericCommand::DisplayType type);
			ResponseLine(std::string response, GenericCommand::DisplayType type);
		}